

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O1

Result wabt::ParseFloat(LiteralType literal_type,char *s,char *end,uint32_t *out_bits)

{
  Enum EVar1;
  
  EVar1 = (*(code *)(&DAT_011e7bf8 + *(int *)(&DAT_011e7bf8 + (ulong)literal_type * 4)))();
  return (Result)EVar1;
}

Assistant:

Result ParseFloat(LiteralType literal_type,
                  const char* s,
                  const char* end,
                  uint32_t* out_bits) {
  return FloatParser<float>::Parse(literal_type, s, end, out_bits);
}